

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connections.cpp
# Opt level: O3

shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>_>
 __thiscall
tinygraph::vertex_link_abi_cxx11_
          (tinygraph *this,shared_ptr<tinygraph::Vertex> *from,shared_ptr<tinygraph::Vertex> *to,
          bool undirected)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
  *__tmp;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>_>
  sVar5;
  shared_ptr<tinygraph::Edge> to_edge;
  shared_ptr<tinygraph::Edge> from_edge;
  undefined1 local_59;
  value_type local_58;
  value_type local_48;
  shared_ptr<tinygraph::Vertex> local_38;
  shared_ptr<tinygraph::Vertex> local_28;
  
  peVar1 = (from->super___shared_ptr<tinygraph::Vertex,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_38.super___shared_ptr<tinygraph::Vertex,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (from->super___shared_ptr<tinygraph::Vertex,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (from->super___shared_ptr<tinygraph::Vertex,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (from->super___shared_ptr<tinygraph::Vertex,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  local_28.super___shared_ptr<tinygraph::Vertex,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (to->super___shared_ptr<tinygraph::Vertex,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_28.super___shared_ptr<tinygraph::Vertex,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (to->super___shared_ptr<tinygraph::Vertex,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (to->super___shared_ptr<tinygraph::Vertex,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (to->super___shared_ptr<tinygraph::Vertex,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  local_58.super___shared_ptr<tinygraph::Edge,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_38.super___shared_ptr<tinygraph::Vertex,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<tinygraph::Edge,std::allocator<tinygraph::Edge>,std::shared_ptr<tinygraph::Vertex>&>
            (&local_58.super___shared_ptr<tinygraph::Edge,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (Edge **)&local_58,(allocator<tinygraph::Edge> *)&local_48,&local_28);
  p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x40);
  p_Var3->_M_use_count = 1;
  p_Var3->_M_weak_count = 1;
  p_Var3->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0010ec80;
  p_Var3[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var3[1]._M_use_count = 0;
  p_Var3[1]._M_weak_count = 0;
  p_Var3[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  *(_Atomic_word **)&p_Var3[2]._M_use_count = &p_Var3[1]._M_use_count;
  p_Var3[3]._vptr__Sp_counted_base = (_func_int **)&p_Var3[1]._M_use_count;
  p_Var3[3]._M_use_count = 0;
  p_Var3[3]._M_weak_count = 0;
  ((local_58.super___shared_ptr<tinygraph::Edge,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->properties).
  super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)(p_Var3 + 1);
  p_Var2 = ((local_58.super___shared_ptr<tinygraph::Edge,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           properties).
           super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  ((local_58.super___shared_ptr<tinygraph::Edge,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->properties).
  super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var3;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  std::vector<std::shared_ptr<tinygraph::Edge>,_std::allocator<std::shared_ptr<tinygraph::Edge>_>_>
  ::push_back(&peVar1->connections,&local_58);
  _Var4._M_pi = extraout_RDX;
  if (undirected) {
    local_48.super___shared_ptr<tinygraph::Edge,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<tinygraph::Edge,std::allocator<tinygraph::Edge>,std::shared_ptr<tinygraph::Vertex>&>
              (&local_48.super___shared_ptr<tinygraph::Edge,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ,(Edge **)&local_48,(allocator<tinygraph::Edge> *)&local_59,&local_38);
    ((local_48.super___shared_ptr<tinygraph::Edge,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->properties).
    super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = ((local_58.super___shared_ptr<tinygraph::Edge,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              properties).
              super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&((local_48.super___shared_ptr<tinygraph::Edge,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                properties).
                super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,
               &((local_58.super___shared_ptr<tinygraph::Edge,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                properties).
                super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::
    vector<std::shared_ptr<tinygraph::Edge>,_std::allocator<std::shared_ptr<tinygraph::Edge>_>_>::
    push_back(&(((local_58.super___shared_ptr<tinygraph::Edge,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                to).super___shared_ptr<tinygraph::Vertex,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               connections,&local_48);
    _Var4._M_pi = extraout_RDX_00;
    if (local_48.super___shared_ptr<tinygraph::Edge,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_48.super___shared_ptr<tinygraph::Edge,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var4._M_pi = extraout_RDX_01;
    }
  }
  *(element_type **)this =
       ((local_58.super___shared_ptr<tinygraph::Edge,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
       properties).
       super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr;
  p_Var2 = ((local_58.super___shared_ptr<tinygraph::Edge,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           properties).
           super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  if (local_58.super___shared_ptr<tinygraph::Edge,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<tinygraph::Edge,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var4._M_pi = extraout_RDX_02;
  }
  if (local_28.super___shared_ptr<tinygraph::Vertex,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<tinygraph::Vertex,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var4._M_pi = extraout_RDX_03;
  }
  if (local_38.super___shared_ptr<tinygraph::Vertex,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<tinygraph::Vertex,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var4._M_pi = extraout_RDX_04;
  }
  sVar5.
  super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var4._M_pi;
  sVar5.
  super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>_>
          )sVar5.
           super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

std::shared_ptr<std::map<std::string, std::any>> vertex_link(std::shared_ptr<Vertex> from, std::shared_ptr<Vertex> to, bool undirected) {
        auto from_cp = std::move(from);
        auto to_cp = std::move(to);

        auto to_edge = std::make_shared<Edge>(to_cp);
        to_edge->properties = std::make_shared<std::map<std::string, std::any>>();
        from_cp->connections.push_back(to_edge);

        if (undirected) {
            auto from_edge = std::make_shared<Edge>(from_cp);
            from_edge->properties = to_edge->properties;
            to_edge->to->connections.push_back(from_edge);
        }

        return to_edge->properties;
    }